

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmFPU_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmFGeneric<(moira::Instr)224,(moira::Mode)1,0>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  Syntax SVar2;
  char cVar3;
  uint uVar4;
  long lVar5;
  char *pcVar6;
  
  *addr = *addr + 2;
  uVar4 = (*this->_vptr_Moira[6])();
  uVar4 = uVar4 & 0xffff;
  if ((uVar4 >> 0xe & 1) == 0) {
    cVar3 = 'f';
    lVar5 = 0;
    do {
      pcVar6 = str->ptr;
      str->ptr = pcVar6 + 1;
      *pcVar6 = cVar3;
      cVar3 = "fcos"[lVar5 + 1];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    StrWriter::operator<<(str,(Ffmt)0x2);
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar6 = str->ptr;
      str->ptr = pcVar6 + 1;
      *pcVar6 = ' ';
    }
    else {
      iVar1 = (str->tab).raw;
      pcVar6 = str->ptr;
      do {
        str->ptr = pcVar6 + 1;
        *pcVar6 = ' ';
        pcVar6 = str->ptr;
      } while (pcVar6 < str->base + iVar1);
    }
    StrWriter::operator<<(str,(Fp)(uVar4 >> 10 & 7));
  }
  else {
    cVar3 = 'f';
    lVar5 = 0;
    do {
      pcVar6 = str->ptr;
      str->ptr = pcVar6 + 1;
      *pcVar6 = cVar3;
      cVar3 = "fcos"[lVar5 + 1];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    StrWriter::operator<<(str,(Ffmt)(uVar4 >> 10 & 7));
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar6 = str->ptr;
      str->ptr = pcVar6 + 1;
      *pcVar6 = ' ';
    }
    else {
      iVar1 = (str->tab).raw;
      pcVar6 = str->ptr;
      do {
        str->ptr = pcVar6 + 1;
        *pcVar6 = ' ';
        pcVar6 = str->ptr;
      } while (pcVar6 < str->base + iVar1);
    }
    StrWriter::operator<<(str,(An)(op & 7));
  }
  pcVar6 = str->ptr;
  str->ptr = pcVar6 + 1;
  *pcVar6 = ',';
  SVar2 = str->style->syntax;
  if ((SVar2 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar2 & 0x1f) & 1) != 0)) {
    pcVar6 = str->ptr;
    str->ptr = pcVar6 + 1;
    *pcVar6 = ' ';
  }
  StrWriter::operator<<(str,(Fp)(uVar4 >> 7 & 7));
  return;
}

Assistant:

void
Moira::dasmFGeneric(StrWriter &str, u32 &addr, u16 op) const
{
    auto ext = dasmIncRead(addr);
    auto reg = _____________xxx (op);
    auto src = ___xxx__________ (ext);
    auto dst = ______xxx_______ (ext);

    if (ext & 0x4000) {

        if (M == Mode::IM) {

            u64 val;

            switch (src) {

                case 0: // Long-Word Integer

                    val = dasmIncRead<Long>(addr);
                    str << Ins<I>{} << Ffmt{src} << str.tab << Ims<Long>(u32(val));
                    break;

                case 1: // Single precision

                    val = dasmIncRead<Long>(addr);
                    str << Ins<I>{} << Ffmt{src} << str.tab << "#<fixme>";
                    break;

                case 2: // Double precision
                case 3: // Packed-Decimal Real

                    val = dasmIncRead<Long>(addr);
                    dasmIncRead<Long>(addr);
                    dasmIncRead<Long>(addr); // Why???
                    str << Ins<I>{} << Ffmt{src} << str.tab << "#<fixme>";
                    break;

                case 5: // Double-precision real

                    val = dasmIncRead<Long>(addr);
                    dasmIncRead<Long>(addr);
                    str << Ins<I>{} << Ffmt{src} << str.tab << "#<fixme>";
                    break;

                case 6: // Byte Integer
                    val = dasmIncRead<Word>(addr);
                    str << Ins<I>{} << Ffmt{src} << str.tab << Ims<Byte>(u32(val));
                    break;

                default:
                    str << Ins<I>{} << Ffmt{src} << str.tab << Op<M, Word>(reg, addr);
            }
        } else {
            str << Ins<I>{} << Ffmt{src} << str.tab << Op<M, Long>(reg, addr);
        }

    } else {
        str << Ins<I>{} << Ffmt{2} << str.tab << Fp{src};
    }

    str << Sep{} << Fp{dst};
}